

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

string * __thiscall
LPCMStreamReader::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,LPCMStreamReader *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  uint local_1c4;
  uint32_t bitrate;
  int mch;
  ostringstream str;
  LPCMStreamReader *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&bitrate);
  bVar1 = this->m_channels;
  bVar2 = this->m_channels;
  if (this->m_bitsPerSample == 0x14) {
    local_1c4 = 0x18;
  }
  else {
    local_1c4 = (uint)this->m_bitsPerSample;
  }
  iVar3 = this->m_freq;
  poVar4 = std::operator<<((ostream *)&bitrate,"Bitrate: ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(local_1c4 * iVar3 * ((uint)bVar1 + (uint)((uint)bVar2 % 2 == 1))) /
                             1000);
  std::operator<<(poVar4,"Kbps  ");
  poVar4 = std::operator<<((ostream *)&bitrate,"Sample Rate: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_freq / 1000);
  std::operator<<(poVar4,"KHz  ");
  std::operator<<((ostream *)&bitrate,"Channels: ");
  if ((this->m_lfeExists & 1U) == 0) {
    std::ostream::operator<<((ostream *)&bitrate,(uint)this->m_channels);
  }
  else {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&bitrate,this->m_channels - 1);
    std::operator<<(poVar4,".1");
  }
  poVar4 = std::operator<<((ostream *)&bitrate,"  Bits per sample: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_bitsPerSample);
  std::operator<<(poVar4,"bit");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bitrate);
  return __return_storage_ptr__;
}

Assistant:

const std::string LPCMStreamReader::getStreamInfo()
{
    std::ostringstream str;
    const int mch = m_channels + (m_channels % 2 == 1 ? 1 : 0);
    const uint32_t bitrate = (m_bitsPerSample == 20 ? 24 : m_bitsPerSample) * m_freq * mch;
    str << "Bitrate: " << bitrate / 1000 << "Kbps  ";
    str << "Sample Rate: " << m_freq / 1000 << "KHz  ";
    str << "Channels: ";
    if (m_lfeExists)
        str << static_cast<int>(m_channels) - 1 << ".1";
    else
        str << static_cast<int>(m_channels);
    str << "  Bits per sample: " << m_bitsPerSample << "bit";
    return str.str();
}